

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::eq_bool(Parser *this)

{
  lex_t lVar1;
  undefined8 *puVar2;
  _Elt_pointer pLVar3;
  
  pLVar3 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar3 == (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pLVar3 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
  }
  lVar1 = Lex::get_type(pLVar3 + -1);
  if (lVar1 == LEX_BOOL) {
    std::deque<Lex,_std::allocator<Lex>_>::pop_back(&(this->lex_stack).c);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "expression is not boolean";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

void Parser::eq_bool() {
    if ( lex_stack.top().get_type() != LEX_BOOL )
        throw "expression is not boolean";
    lex_stack.pop();
}